

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-mon.c
# Opt level: O1

void project_m(source origin,wchar_t r,loc_conflict grid,wchar_t dam,wchar_t typ,wchar_t flg,
              _Bool *did_hit,_Bool *was_obvious)

{
  byte *pbVar1;
  project_monster_handler_f p_Var2;
  bool bVar3;
  monster_group_info group_info;
  mon_messages msg_code;
  mon_messages mVar4;
  loc grid_00;
  _Bool _Var5;
  _Bool _Var6;
  _Bool _Var7;
  byte bVar8;
  short sVar9;
  uint32_t uVar10;
  uint uVar11;
  square *psVar12;
  monster_conflict *pmVar13;
  monster *pmVar14;
  monster_race *pmVar15;
  wchar_t i;
  long lVar16;
  monster_race *pmVar17;
  wchar_t wVar18;
  wchar_t wVar19;
  wchar_t wVar20;
  anon_enum_32 aVar21;
  uint32_t m;
  char *fmt;
  int iVar22;
  char cVar23;
  wchar_t wVar24;
  source origin_00;
  wchar_t local_128;
  project_monster_handler_context_t local_120;
  monster_race *local_a8;
  loc local_a0;
  wchar_t local_98;
  wchar_t local_94;
  monster_race *local_90;
  char m_name [80];
  
  local_a0.x = r;
  aVar21 = origin.what;
  if (aVar21 == SRC_PLAYER) {
    _Var5 = flag_has_dbg((player->state).pflags,10,0x1e,"player->state.pflags","(PF_CHARM)");
    local_120.beguile =
         flag_has_dbg((player->state).pflags,10,0x41,"player->state.pflags","(PF_BEGUILE)");
  }
  else {
    _Var5 = false;
    local_120.beguile = false;
  }
  psVar12 = square(cave,(loc)grid);
  sVar9 = psVar12->mon;
  local_120.r = local_a0.x;
  local_120.seen = false;
  local_120.mon = (monster *)0x0;
  local_120.lore = (monster_lore *)0x0;
  local_120.obvious = SUB41((uint)(flg & 0x100U) >> 8,0);
  p_Var2 = monster_handlers[typ];
  local_120.skipped = false;
  local_120.flag = 0;
  local_120.do_poly = L'\0';
  local_120.teleport_distance = L'\0';
  local_120.hurt_msg = MON_MSG_NONE;
  local_120.die_msg = MON_MSG_DIE;
  local_120.mon_timed[0] = L'\0';
  local_120.mon_timed[1] = L'\0';
  local_120.mon_timed[2] = L'\0';
  local_120.mon_timed[3] = L'\0';
  local_120.mon_timed[4] = L'\0';
  local_120.mon_timed[5] = L'\0';
  local_120.mon_timed[6] = L'\0';
  local_120.mon_timed[7] = L'\0';
  local_120.mon_timed[8] = L'\0';
  local_120.mon_timed[9] = L'\0';
  *did_hit = false;
  *was_obvious = false;
  local_120.origin.what = aVar21;
  local_120.origin.which = origin.which;
  local_120.grid = (loc)grid;
  local_120.dam = dam;
  local_120.type = typ;
  local_120.id = aVar21 == SRC_PLAYER && (flg & 0x100U) == 0;
  local_120.charm = _Var5;
  _Var5 = square_ispassable(cave,(loc)grid);
  if (sVar9 < 1 || !_Var5) {
    return;
  }
  wVar18 = (wchar_t)sVar9;
  local_128 = origin.which._0_4_;
  if ((aVar21 == SRC_MONSTER) && (local_128 == wVar18)) {
    return;
  }
  pmVar13 = (monster_conflict *)cave_monster(cave,wVar18);
  local_120.lore = get_lore(pmVar13->race);
  local_120.mon = (monster *)pmVar13;
  _Var5 = monster_is_camouflaged((monster *)pmVar13);
  if (_Var5) {
    _Var5 = monster_is_in_view((monster *)pmVar13);
  }
  else {
    _Var5 = monster_is_visible((monster *)pmVar13);
  }
  if (_Var5 != false) {
    local_120.seen = true;
  }
  if (((uint)flg >> 9 & 1) != 0 && aVar21 == SRC_MONSTER) {
    pmVar14 = cave_monster(cave,local_128);
    if (pmVar14 == (monster *)0x0) {
      return;
    }
    if (pmVar14->race == pmVar13->race) {
      return;
    }
  }
  _Var5 = square_isprotect(cave,(loc)grid);
  if ((((_Var5) && (uVar10 = Rand_div(4), uVar10 == 0)) &&
      (_Var5 = flag_has_dbg(pmVar13->race->flags,0xc,0x1b,"mon->race->flags","RF_NEVER_MOVE"),
      !_Var5)) && (pmVar13->m_timed[0] == 0)) {
    monster_desc(m_name,0x50,(monster *)pmVar13,L'̔');
    _Var5 = square_isrubble(cave,(loc)grid);
    if (_Var5) {
      fmt = "%s ducks behind a boulder!";
LAB_001c65b7:
      msg(fmt,m_name);
      return;
    }
    _Var5 = square_istree(cave,(loc)grid);
    if (_Var5) {
      fmt = "%s hides behind a tree!";
      goto LAB_001c65b7;
    }
  }
  _Var5 = monster_is_destroyed((monster *)pmVar13);
  if (_Var5) {
    local_120.die_msg = MON_MSG_DESTROYED;
  }
  if ((((flg & 8U) != 0) && (_Var5 = monster_is_camouflaged((monster *)pmVar13), _Var5)) &&
     (_Var5 = monster_is_in_view((monster *)pmVar13), _Var5)) {
    become_aware((chunk *)cave,pmVar13);
    _Var5 = monster_is_visible((monster *)pmVar13);
    if (_Var5) {
      local_120.seen = true;
    }
  }
  if ((projections[typ].obvious == true) && (local_120.seen == true)) {
    local_120.obvious = true;
  }
  local_120.dam =
       terrain_adjust_dam((player *)0x0,(monster_conflict *)local_120.mon,typ,local_120.dam);
  if (typ != L'>') {
    (*p_Var2)(&local_120);
  }
  if (projections[typ].wake == true) {
    monster_wake(pmVar13,false,L'd');
  }
  pmVar14 = local_120.mon;
  _Var5 = local_120.seen;
  wVar24 = local_120.dam;
  if (local_120.skipped != false) {
    return;
  }
  msg_code = local_120.hurt_msg;
  mVar4 = local_120.die_msg;
  if (aVar21 == SRC_MONSTER) {
    _Var6 = monster_is_unique(local_120.mon);
    if ((_Var6) && (pmVar14->hp <= wVar24)) {
      wVar24 = (int)pmVar14->hp;
    }
    if ((monster_conflict *)player->upkeep->health_who == (monster_conflict *)pmVar14) {
      pbVar1 = (byte *)((long)&player->upkeep->redraw + 1);
      *pbVar1 = *pbVar1 | 2;
    }
    monster_wake((monster_conflict *)pmVar14,false,L'\0');
    uVar11 = *(int *)&pmVar14->hp - wVar24;
    sVar9 = (short)uVar11;
    pmVar14->hp = sVar9;
    _Var6 = SUB41((uVar11 & 0xffff) >> 0xf,0);
    if (sVar9 < 0) {
      wVar24 = L'.';
      if (_Var5 != false) {
        wVar24 = mVar4;
      }
      add_monster_message((monster_conflict *)pmVar14,wVar24,false);
      monster_death((monster_conflict *)pmVar14,player,false);
      delete_monster_idx((chunk *)cave,wVar18);
    }
    else {
      _Var7 = monster_is_camouflaged(pmVar14);
      if (!_Var7) {
        if ((msg_code != L'\0' & _Var5) == 1) {
          add_monster_message((monster_conflict *)pmVar14,msg_code,false);
        }
        else if (L'\0' < wVar24) {
          message_pain((monster_conflict *)pmVar14,wVar24);
        }
      }
    }
  }
  else {
    m_name._0_8_ = m_name._0_8_ & 0xffffffffffffff00;
    if (local_120.origin.what == SRC_PLAYER) {
      cVar23 = (player->opts).opt[3];
    }
    else {
      cVar23 = '\0';
    }
    if ((local_120.mon)->hp < local_120.dam) {
      wVar20 = L'.';
      if (local_120.seen != false) {
        wVar20 = local_120.die_msg;
      }
      if (cVar23 == '\0') {
        add_monster_message((monster_conflict *)local_120.mon,wVar20,false);
      }
      else {
        add_monster_message_show_damage
                  ((monster_conflict *)local_120.mon,wVar20,false,local_120.dam);
      }
    }
    if (wVar24 == L'\0') {
      _Var6 = false;
    }
    else {
      _Var6 = mon_take_hit((monster_conflict *)pmVar14,player,wVar24,(_Bool *)m_name,"");
    }
    if (_Var6 == false) {
      bVar8 = msg_code != L'\0' & _Var5;
      if (cVar23 == '\0') {
        if (bVar8 == 0) {
          if (L'\0' < wVar24) {
            message_pain((monster_conflict *)pmVar14,wVar24);
          }
        }
        else {
          add_monster_message((monster_conflict *)pmVar14,msg_code,false);
        }
      }
      else if (bVar8 == 0) {
        if (L'\0' < wVar24) {
          message_pain_show_damage((monster_conflict *)pmVar14,wVar24);
        }
      }
      else {
        add_monster_message_show_damage((monster_conflict *)pmVar14,msg_code,false,wVar24);
      }
      if ((_Var5 != false) && (m_name[0] == '\x01')) {
        add_monster_message((monster_conflict *)pmVar14,L'%',true);
      }
    }
  }
  pmVar13 = (monster_conflict *)local_120.mon;
  wVar24 = local_120.type;
  if (_Var6 != false) goto LAB_001c637f;
  if (local_120.do_poly == L'\0') {
    if (local_120.teleport_distance < L'\x01') {
      lVar16 = 0;
      do {
        if ((L'\0' < local_120.mon_timed[lVar16]) &&
           (mon_inc_timed((monster *)pmVar13,(wchar_t)lVar16,local_120.mon_timed[lVar16],
                          local_120.flag | 1), local_120.seen == true)) {
          local_120.obvious = true;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != 10);
    }
    else {
      strnfmt(m_name,5,"%d");
      origin_00._4_4_ = 0;
      origin_00.what = local_120.origin.what;
      origin_00.which.trap = local_120.origin.which.trap;
      effect_simple(L';',origin_00,m_name,L'\0',L'\0',L'\0',local_120.grid.y,local_120.grid.x,
                    (_Bool *)0x0);
      monster_wake(pmVar13,false,L'\0');
    }
    goto LAB_001c637f;
  }
  local_a0 = local_120.grid;
  _Var5 = monster_is_unique(local_120.mon);
  if ((_Var5) || (player->upkeep->arena_level == true)) {
LAB_001c625d:
    if (local_120.seen != true) goto LAB_001c637f;
    wVar18 = L'\b';
  }
  else {
    if (local_120.seen == true) {
      local_120.obvious = true;
    }
    uVar10 = 1;
    if (L'\v' < local_120.do_poly) {
      uVar10 = local_120.do_poly + L'\xfffffff6';
    }
    m = 0x5a;
    if (wVar24 == L'4') {
      m = uVar10;
    }
    uVar10 = Rand_div(m);
    wVar20 = uVar10 + L'\x01';
    if (wVar24 == L'4') {
      wVar20 = uVar10 + L'\v';
    }
    if (wVar20 < ((monster *)pmVar13)->race->level) {
      if (local_120.seen != true) goto LAB_001c637f;
      wVar18 = L'\b';
      if (wVar24 == L'4') {
        wVar18 = L'3';
      }
    }
    else {
      pmVar15 = ((monster *)pmVar13)->race;
      if (((monster *)pmVar13)->original_race != (monster_race *)0x0) {
        pmVar15 = ((monster *)pmVar13)->original_race;
      }
      if ((pmVar15 == (monster_race *)0x0) || (pmVar15->name == (char *)0x0)) {
        __assert_fail("race && race->name",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/project-mon.c"
                      ,0x32,"struct monster_race *poly_race(struct monster_race *, int)");
      }
      wVar24 = (wchar_t)player->depth;
      _Var5 = flag_has_dbg(pmVar15->flags,0xc,1,"race->flags","RF_UNIQUE");
      pmVar17 = pmVar15;
      if (!_Var5) {
        wVar20 = pmVar15->level;
        iVar22 = wVar20 * 3 + 3;
        if (-1 < wVar20 * 3) {
          iVar22 = wVar20 * 3;
        }
        local_94 = iVar22 >> 2;
        if (wVar20 + L'\xfffffff6' < iVar22 >> 2) {
          local_94 = wVar20 + L'\xfffffff6';
        }
        iVar22 = wVar20 * 5 + 3;
        if (-1 < wVar20 * 5) {
          iVar22 = wVar20 * 5;
        }
        wVar19 = iVar22 >> 2;
        if (iVar22 >> 2 < wVar20 + L'\n') {
          wVar19 = wVar20 + L'\n';
        }
        local_a8 = pmVar15;
        uVar10 = Rand_div(100);
        if (uVar10 == 0) {
          wVar19 = L'd';
        }
        iVar22 = 1000;
        local_98 = wVar19;
        do {
          pmVar15 = get_mon_num((wVar20 + wVar24) / 2 + L'\x05',wVar24);
          bVar3 = true;
          if ((pmVar15 != (monster_race *)0x0) && (pmVar15 != local_a8)) {
            _Var5 = flag_has_dbg(pmVar15->flags,0xc,1,"new_race->flags","RF_UNIQUE");
            if (((!_Var5) && ((local_94 <= pmVar15->level && (pmVar15->level <= local_98)))) &&
               ((_Var5 = flag_has_dbg(pmVar15->flags,0xc,0xc,"new_race->flags","RF_FORCE_DEPTH"),
                !_Var5 || (pmVar15->level <= wVar24)))) {
              bVar3 = false;
              local_90 = pmVar15;
            }
          }
          pmVar15 = local_90;
          pmVar17 = local_a8;
        } while ((bVar3) && (iVar22 = iVar22 + -1, pmVar15 = local_a8, iVar22 != 0));
      }
      if (pmVar15 == pmVar17) goto LAB_001c625d;
      m_name[0] = '\0';
      m_name[1] = '\0';
      m_name[2] = '\0';
      m_name[3] = '\0';
      m_name[4] = '\0';
      m_name[5] = '\0';
      m_name[6] = '\0';
      m_name[7] = '\0';
      m_name[8] = '\0';
      m_name[9] = '\0';
      m_name[10] = '\0';
      m_name[0xb] = '\0';
      m_name[0xc] = '\0';
      m_name[0xd] = '\0';
      m_name[0xe] = '\0';
      m_name[0xf] = '\0';
      if (local_120.seen == true) {
        add_monster_message(pmVar13,L'\x16',false);
      }
      delete_monster_idx((chunk *)cave,wVar18);
      grid_00 = local_a0;
      group_info.player_race = (player_race *)m_name._8_8_;
      group_info._0_8_ = m_name._0_8_;
      place_new_monster((chunk *)cave,local_a0,pmVar15,false,false,group_info,'\x17');
      local_120.mon = square_monster(cave,grid_00);
      if (((monster_conflict *)local_120.mon == (monster_conflict *)0x0 || local_120.seen != false)
         || (_Var5 = monster_is_visible(local_120.mon), !_Var5)) goto LAB_001c637f;
      pmVar13 = (monster_conflict *)local_120.mon;
      wVar18 = L'6';
    }
  }
  add_monster_message(pmVar13,wVar18,false);
LAB_001c637f:
  _Var5 = local_120.obvious;
  pmVar14 = local_120.mon;
  if ((monster_conflict *)local_120.mon != (monster_conflict *)0x0) {
    if ((_Var6 == false) &&
       (update_mon((monster_conflict *)local_120.mon,(chunk *)cave,false), aVar21 == SRC_PLAYER)) {
      ((target *)&pmVar14->target)->midx = L'\xffffffff';
    }
    square_light_spot((chunk *)cave,*(loc *)&pmVar14->grid);
    if (player->upkeep->monster_race == pmVar14->race) {
      pbVar1 = (byte *)((long)&player->upkeep->redraw + 2);
      *pbVar1 = *pbVar1 | 0x10;
    }
  }
  *did_hit = true;
  *was_obvious = _Var5;
  return;
}

Assistant:

void project_m(struct source origin, int r, struct loc grid, int dam, int typ,
			   int flg, bool *did_hit, bool *was_obvious)
{
	struct monster *mon;
	struct monster_lore *lore;

	/* Is the monster "seen"? */
	bool seen = false;
	bool mon_died = false;

	/* Is the effect obvious? */
	bool obvious = (flg & PROJECT_AWARE ? true : false);

	/* Are we trying to id the source of this effect? */
	bool id = (origin.what == SRC_PLAYER) ? !obvious : false;

	/* Is the source an extra charming player? */
	bool charm = (origin.what == SRC_PLAYER) ?
		player_has(player, PF_CHARM) : false;

	/* Is the source an extra beguiling player? */
	bool beguile = (origin.what == SRC_PLAYER) ?
		player_has(player, PF_BEGUILE) : false;

	int m_idx = square(cave, grid)->mon;

	project_monster_handler_f monster_handler = monster_handlers[typ];
	project_monster_handler_context_t context = {
		origin,
		r,
		grid,
		dam,
		typ,
		seen,
		id,
		NULL, /* mon */
		NULL, /* lore */
		charm,
		beguile,
		obvious,
		false, /* skipped */
		0, /* flag */
		0, /* do_poly */
		0, /* teleport_distance */
		MON_MSG_NONE, /* hurt_msg */
		MON_MSG_DIE, /* die_msg */
		{0, 0, 0, 0, 0, 0},
	};

	*did_hit = false;
	*was_obvious = false;

	/* Walls protect monsters */
	if (!square_ispassable(cave, grid)) return;

	/* No monster here */
	if (!(m_idx > 0)) return;

	/* Never affect projector */
	if (origin.what == SRC_MONSTER && origin.which.monster == m_idx) return;

	/* Obtain monster info */
	mon = cave_monster(cave, m_idx);
	lore = get_lore(mon->race);
	context.mon = mon;
	context.lore = lore;

	/* See visible monsters */
	if (monster_is_camouflaged(mon)) {
		if (monster_is_in_view(mon)) {
			seen = true;
			context.seen = true;
		}
	} else if (monster_is_visible(mon)) {
		seen = true;
		context.seen = seen;
	}

	/* Breathers may not blast members of the same race. */
	if (origin.what == SRC_MONSTER && (flg & PROJECT_SAFE)) {
		/* Point to monster information of caster */
		struct monster *caster = cave_monster(cave, origin.which.monster);
		if (!caster) return;

		/* Skip monsters with the same race */
		if (caster->race == mon->race)
			return;
	}

	/* Determine if terrain is capable of preventing physical damage. */
	if (square_isprotect(cave, grid)) {
		if (one_in_(4) && !rf_has(mon->race->flags, RF_NEVER_MOVE) &&
			!mon->m_timed[MON_TMD_SLEEP]) {
			char m_name[80];

			/* Get the monster name (or "it") */
			monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);

			/* Monsters can duck behind rubble */
			if (square_isrubble(cave, grid)) {
				msg("%s ducks behind a boulder!", m_name);
				return;
			}

			if (square_istree(cave, grid)) {
				msg("%s hides behind a tree!", m_name);
				return;
			}
		}
	}

	/* Some monsters get "destroyed" */
	if (monster_is_destroyed(mon))
		context.die_msg = MON_MSG_DESTROYED;

	/* Reveal a camouflaged monster if in view and it stopped an effect. */
	if ((flg & PROJECT_STOP) && monster_is_camouflaged(mon)
			&& monster_is_in_view(mon)) {
		become_aware(cave, mon);
		/* Reevaluate whether it's seen. */
		if (monster_is_visible(mon)) {
			seen = true;
			context.seen = true;
		}
	}

	/* Force obviousness for certain types if seen. */
	if (projections[typ].obvious && context.seen)
		context.obvious = true;

	/* Adjust damage for terrain */
	context.dam = terrain_adjust_dam(NULL, context.mon, typ, context.dam);

	if (monster_handler != NULL)
		monster_handler(&context);

	/* Wake monster if required */
	if (projections[typ].wake)
		monster_wake(mon, false, 100);

	/* Absolutely no effect */
	if (context.skipped) return;

	/* Apply damage to the monster, based on who did the damage. */
	if (origin.what == SRC_MONSTER) {
		mon_died = project_m_monster_attack(&context, m_idx);
	} else {
		mon_died = project_m_player_attack(&context);
	}

	if (!mon_died) {
		project_m_apply_side_effects(&context, m_idx);
	}

	/* Update locals, since the project_m_* functions can change some values. */
	mon = context.mon;
	obvious = context.obvious;

	/* Check for NULL, since polymorph can occasionally return NULL. */
	if (mon != NULL) {
		/* Update the monster */
		if (!mon_died) {
			update_mon(mon, cave, false);

			/* Become hostile (to the player only, for now) */
			if (origin.what == SRC_PLAYER) {
				mon->target.midx = -1;
			}
		}

		/* Redraw the (possibly new) monster grid */
		square_light_spot(cave, mon->grid);

		/* Update monster recall window */
		if (player->upkeep->monster_race == mon->race) {
			/* Window stuff */
			player->upkeep->redraw |= (PR_MONSTER);
		}
	}

	/* Track it */
	*did_hit = true;

	/* Return "Anything seen?" */
	*was_obvious = !!obvious;
}